

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

void NJamSpell::ToLower(wstring *text)

{
  pointer pwVar1;
  size_type sVar2;
  undefined4 uVar3;
  long lVar4;
  
  pwVar1 = (text->_M_dataplus)._M_p;
  sVar2 = text->_M_string_length;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    uVar3 = (**(code **)(*GWctype + 0x40))(GWctype,*(undefined4 *)((long)pwVar1 + lVar4));
    *(undefined4 *)((long)pwVar1 + lVar4) = uVar3;
  }
  return;
}

Assistant:

void ToLower(std::wstring& text) {
    std::transform(text.begin(), text.end(), text.begin(), [](wchar_t wch) {
        return GWctype.tolower(wch);
    });
}